

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_uintwide_t_spot_values.cpp
# Opt level: O2

bool from_issue_145::
     test_uintwide_t_spot_values_from_issue_145<math::wide_integer::uintwide_t<128u,unsigned_int,void,false>>
               (uintwide_t<128U,_unsigned_int,_void,_false> *x)

{
  undefined1 auVar1 [16];
  bool bVar2;
  enable_if_t<std::is_integral<unsigned_int>::value,_bool> eVar3;
  enable_if_t<std::is_integral<unsigned_int>::value,_bool> eVar4;
  local_unknown_integer_type a;
  uint local_4c;
  uintwide_t<128U,_unsigned_int,_void,_false> local_48;
  undefined1 local_38 [16];
  
  local_48.values.super_array<unsigned_int,_4UL>.elems._0_8_ =
       *(undefined8 *)(x->values).super_array<unsigned_int,_4UL>.elems;
  local_48.values.super_array<unsigned_int,_4UL>.elems._8_8_ =
       *(undefined8 *)((x->values).super_array<unsigned_int,_4UL>.elems + 2);
  math::wide_integer::uintwide_t<128U,_unsigned_int,_void,_false>::operator+=(&local_48,&local_48);
  local_4c = 2;
  local_38 = (undefined1  [16])math::wide_integer::operator*(&local_4c,x);
  bVar2 = math::wide_integer::uintwide_t<128U,_unsigned_int,_void,_false>::operator==
                    (&local_48,(uintwide_t<128U,_unsigned_int,_void,_false> *)local_38);
  local_48.values.super_array<unsigned_int,_4UL>.elems._0_8_ =
       *(undefined8 *)(x->values).super_array<unsigned_int,_4UL>.elems;
  local_48.values.super_array<unsigned_int,_4UL>.elems._8_8_ =
       *(undefined8 *)((x->values).super_array<unsigned_int,_4UL>.elems + 2);
  math::wide_integer::uintwide_t<128U,_unsigned_int,_void,_false>::operator-=(&local_48,&local_48);
  auVar1._12_4_ = 0;
  auVar1._0_12_ = local_38._4_12_;
  local_38 = auVar1 << 0x20;
  eVar3 = math::wide_integer::operator==(&local_48,(uint *)local_38);
  local_48.values.super_array<unsigned_int,_4UL>.elems._0_8_ =
       *(undefined8 *)(x->values).super_array<unsigned_int,_4UL>.elems;
  local_48.values.super_array<unsigned_int,_4UL>.elems._8_8_ =
       *(undefined8 *)((x->values).super_array<unsigned_int,_4UL>.elems + 2);
  math::wide_integer::uintwide_t<128U,_unsigned_int,_void,_false>::operator/=(&local_48,&local_48);
  local_38._0_4_ = 1;
  eVar4 = math::wide_integer::operator==(&local_48,(uint *)local_38);
  return eVar4 && (eVar3 && bVar2);
}

Assistant:

auto test_uintwide_t_spot_values_from_issue_145(const UnknownIntegerType& x) -> bool
  {
    // See also https://github.com/ckormanyos/wide-integer/issues/145#issuecomment-1006374713

    using local_unknown_integer_type = UnknownIntegerType;

    bool local_result_is_ok = true;

    #if (defined(__clang__) && (defined(__clang_major__) && (__clang_major__ > 6)))
    #pragma GCC diagnostic push
    #pragma GCC diagnostic ignored "-Wself-assign-overloaded"
    #endif

    {
      local_unknown_integer_type a = x; a += a; // NOLINT(clang-diagnostic-self-assign-overloaded)

      local_result_is_ok = ((a == (2U * x)) && local_result_is_ok);
    }

    {
      local_unknown_integer_type a = x; a -= a; // NOLINT(clang-diagnostic-self-assign-overloaded)

      local_result_is_ok = ((a == 0U) && local_result_is_ok);
    }

    {
      local_unknown_integer_type a = x; a /= a; // NOLINT(clang-diagnostic-self-assign-overloaded)

      local_result_is_ok = ((a == 1U) && local_result_is_ok);
    }

    #if (defined(__clang__) && (defined(__clang_major__) && (__clang_major__ > 6)))
    #pragma GCC diagnostic pop
    #endif

    return local_result_is_ok;
  }